

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

ptr __thiscall
gch::detail::small_vector_base<std::allocator<int>,64u>::append_element<int_const&>
          (small_vector_base<std::allocator<int>,64u> *this,int *args)

{
  long lVar1;
  ulong uVar2;
  int *__dest;
  ulong uVar3;
  ulong __n;
  
  if (*(ulong *)(this + 0x10) < *(ulong *)(this + 8)) {
    *(int *)(*(long *)this + *(ulong *)(this + 0x10) * 4) = *args;
    lVar1 = *(long *)(this + 0x10);
    *(long *)(this + 0x10) = lVar1 + 1;
    return (ptr)(*(long *)this + lVar1 * 4);
  }
  if (*(long *)(this + 0x10) != 0x1fffffffffffffff) {
    uVar3 = *(long *)(this + 0x10) + 1;
    uVar2 = *(ulong *)(this + 8);
    __n = uVar2 * 2;
    if (uVar2 * 2 <= uVar3) {
      __n = uVar3;
    }
    if (0x1fffffffffffffff - uVar2 <= uVar2) {
      __n = 0x1fffffffffffffff;
    }
    __dest = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)this,__n,(void *)(uVar2 * 4 + *(long *)this));
    lVar1 = *(long *)(this + 0x10);
    __dest[lVar1] = *args;
    if (*(long *)(this + 0x10) != 0) {
      memcpy(__dest,*(void **)this,*(long *)(this + 0x10) << 2);
    }
    if (0x40 < *(ulong *)(this + 8)) {
      operator_delete(*(void **)this,*(ulong *)(this + 8) << 2);
    }
    *(int **)this = __dest;
    *(ulong *)(this + 8) = __n;
    *(ulong *)(this + 0x10) = uVar3;
    return __dest + lVar1;
  }
  small_vector_base<std::allocator<int>,_64U>::throw_allocation_size_error();
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }